

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O0

void __thiscall CRegexParser::reset(CRegexParser *this)

{
  int *in_RDI;
  re_tuple *t;
  int i;
  int *local_18;
  int local_c;
  
  local_c = 0;
  local_18 = *(int **)(in_RDI + 2);
  for (; local_c < *in_RDI; local_c = local_c + 1) {
    if (((*local_18 == 0xf) || (*local_18 == 0x10)) && (*(long *)(local_18 + 2) != 0)) {
      if (*(void **)(local_18 + 2) != (void *)0x0) {
        operator_delete__(*(void **)(local_18 + 2));
      }
      local_18[2] = 0;
      local_18[3] = 0;
    }
    else if ((*local_18 == 2) && (*(long *)(local_18 + 2) != 0)) {
      if (*(void **)(local_18 + 2) != (void *)0x0) {
        operator_delete__(*(void **)(local_18 + 2));
      }
      local_18[2] = 0;
      local_18[3] = 0;
    }
    *local_18 = 0;
    local_18 = local_18 + 10;
  }
  *in_RDI = 0;
  return;
}

Assistant:

void CRegexParser::reset()
{
    /* delete any range tables we've allocated */
    int i;
    re_tuple *t;
    for (i = 0, t = tuple_arr_ ; i < next_state_ ; ++i, ++t)
    {
        /* if it's a range, delete the allocated range */
        if ((t->typ == RE_RANGE || t->typ == RE_RANGE_EXCL)
            && t->info.range.char_range != 0)
        {
            delete [] t->info.range.char_range;
            t->info.range.char_range = 0;
        }
        else if (t->typ == RE_LITSTR && t->info.str.str != 0)
        {
            delete [] t->info.str.str;
            t->info.str.str = 0;
        }

        /* clear the tuple type */
        t->typ = RE_INVALID;
    }

    /* clear states */
    next_state_ = RE_STATE_FIRST_VALID;
}